

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CheckObjectName(Parse *pParse,char *zName)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((((pParse->db->init).busy == '\0') && (pParse->nested == '\0')) &&
     (iVar2 = 0, (pParse->db->flags & 1) == 0)) {
    iVar1 = sqlite3_strnicmp(zName,"sqlite_",7);
    if (iVar1 == 0) {
      sqlite3ErrorMsg(pParse,"object name reserved for internal use: %s",zName);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckObjectName(Parse *pParse, const char *zName){
  if( !pParse->db->init.busy && pParse->nested==0 
          && (pParse->db->flags & SQLITE_WriteSchema)==0
          && 0==sqlite3StrNICmp(zName, "sqlite_", 7) ){
    sqlite3ErrorMsg(pParse, "object name reserved for internal use: %s", zName);
    return SQLITE_ERROR;
  }
  return SQLITE_OK;
}